

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLURL::setURL(XMLURL *this,XMLURL *baseURL,XMLCh *relativeURL)

{
  bool bVar1;
  XMLCh *relativeURL_local;
  XMLURL *baseURL_local;
  XMLURL *this_local;
  
  cleanUp(this);
  parse(this,relativeURL);
  bVar1 = isRelative(this);
  if (bVar1) {
    conglomerateWithBase(this,baseURL,true);
  }
  return;
}

Assistant:

void XMLURL::setURL(const XMLURL&         baseURL
                  , const XMLCh* const    relativeURL)
{
    cleanUp();

	// Parse our URL string
    parse(relativeURL);

    // If its relative, then conglomerate with the base URL
    if (isRelative())
		conglomerateWithBase(baseURL);
}